

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

bool tcu::isAccessValid(TextureFormat format,TextureAccessType type)

{
  ChannelOrder CVar1;
  bool bVar2;
  
  CVar1 = format.order;
  if (CVar1 == DS) {
    return false;
  }
  if (CVar1 == S) {
    bVar2 = type == TEXTUREACCESSTYPE_UNSIGNED_INT;
  }
  else {
    if (CVar1 != D) {
      return type == TEXTUREACCESSTYPE_FLOAT || format.type >> 1 != 0xb;
    }
    bVar2 = type == TEXTUREACCESSTYPE_FLOAT;
  }
  return bVar2;
}

Assistant:

bool isAccessValid (TextureFormat format, TextureAccessType type)
{
	DE_ASSERT(isValid(format));

	if (format.order == TextureFormat::DS)
	{
		// It is never allowed to access combined depth-stencil format with getPixel().
		// Instead either getPixDepth() or getPixStencil(), or effective depth- or stencil-
		// access must be used.
		return false;
	}
	else if (format.order == TextureFormat::D)
		return type == TEXTUREACCESSTYPE_FLOAT;
	else if (format.order == TextureFormat::S)
		return type == TEXTUREACCESSTYPE_UNSIGNED_INT;
	else
	{
		// A few packed color formats have access type restrictions
		if (format.type == TextureFormat::UNSIGNED_INT_11F_11F_10F_REV ||
			format.type == TextureFormat::UNSIGNED_INT_999_E5_REV)
			return type == TEXTUREACCESSTYPE_FLOAT;
		else
			return true;
	}
}